

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O1

void Abc_NodeDelayTraceArrival(Abc_Obj_t *pNode,Vec_Int_t *vSlacks)

{
  Abc_Ntk_t *pAVar1;
  float *pfVar2;
  long *plVar3;
  float *pfVar4;
  double dVar5;
  double dVar6;
  Mio_PinPhase_t MVar7;
  Mio_Pin_t *pMVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  pAVar1 = pNode->pNtk;
  pfVar2 = (float *)pAVar1->pManTime->vArrs->pArray[pNode->Id];
  pfVar2[0] = -1e+09;
  pfVar2[1] = -1e+09;
  if ((((pAVar1->ntkFunc == ABC_FUNC_MAP) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) &&
      ((pNode->vFanins).nSize == 1)) && ((pNode->field_5).pData == (void *)0x0)) {
    plVar3 = (long *)pAVar1->vObjs->pArray[*(pNode->vFanins).pArray];
    *(undefined8 *)pfVar2 =
         **(undefined8 **)
           (*(long *)(*(long *)(*(long *)(*plVar3 + 0x108) + 0x10) + 8) + (long)(int)plVar3[2] * 8);
  }
  else {
    pMVar8 = Mio_GateReadPins((Mio_Gate_t *)(pNode->field_5).pData);
    if (0 < (pNode->vFanins).nSize) {
      lVar11 = 0;
      do {
        plVar3 = (long *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar11]];
        pfVar4 = *(float **)
                  (*(long *)(*(long *)(*(long *)(*plVar3 + 0x108) + 0x10) + 8) +
                  (long)(int)plVar3[2] * 8);
        MVar7 = Mio_PinReadPhase(pMVar8);
        dVar5 = Mio_PinReadDelayBlockRise(pMVar8);
        dVar6 = Mio_PinReadDelayBlockFall(pMVar8);
        if (MVar7 == MIO_PHASE_INV) {
LAB_0031c864:
          fVar12 = (float)dVar5 + pfVar4[1];
          if (*pfVar2 <= fVar12 && fVar12 != *pfVar2) {
            *pfVar2 = fVar12;
          }
          fVar12 = (float)dVar6 + *pfVar4;
          if (pfVar2[1] <= fVar12 && fVar12 != pfVar2[1]) {
            pfVar2[1] = fVar12;
          }
        }
        else {
          fVar12 = *pfVar4 + (float)dVar5;
          if (*pfVar2 <= fVar12 && fVar12 != *pfVar2) {
            *pfVar2 = fVar12;
          }
          fVar12 = pfVar4[1] + (float)dVar6;
          if (pfVar2[1] <= fVar12 && fVar12 != pfVar2[1]) {
            pfVar2[1] = fVar12;
          }
          if (MVar7 != MIO_PHASE_NONINV) goto LAB_0031c864;
        }
        pMVar8 = Mio_PinReadNext(pMVar8);
        lVar11 = lVar11 + 1;
      } while (lVar11 < (pNode->vFanins).nSize);
    }
    if (vSlacks != (Vec_Int_t *)0x0) {
      pMVar8 = Mio_GateReadPins((Mio_Gate_t *)(pNode->field_5).pData);
      if (0 < (pNode->vFanins).nSize) {
        lVar11 = 0;
        do {
          plVar3 = (long *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar11]];
          pfVar4 = *(float **)
                    (*(long *)(*(long *)(*(long *)(*plVar3 + 0x108) + 0x10) + 8) +
                    (long)(int)plVar3[2] * 8);
          MVar7 = Mio_PinReadPhase(pMVar8);
          dVar5 = Mio_PinReadDelayBlockRise(pMVar8);
          dVar6 = Mio_PinReadDelayBlockFall(pMVar8);
          fVar12 = 1e+09;
          if (MVar7 != MIO_PHASE_INV) {
            fVar12 = (*pfVar4 + (float)dVar5) - *pfVar2;
            fVar14 = -fVar12;
            if (-fVar12 <= fVar12) {
              fVar14 = fVar12;
            }
            fVar12 = 1e+09;
            if (fVar14 <= 1e+09) {
              fVar12 = fVar14;
            }
            fVar13 = (pfVar4[1] + (float)dVar6) - pfVar2[1];
            fVar14 = -fVar13;
            if (-fVar13 <= fVar13) {
              fVar14 = fVar13;
            }
            if (fVar14 <= fVar12) {
              fVar12 = fVar14;
            }
          }
          if (MVar7 != MIO_PHASE_NONINV) {
            fVar13 = ((float)dVar5 + pfVar4[1]) - *pfVar2;
            fVar14 = -fVar13;
            if (-fVar13 <= fVar13) {
              fVar14 = fVar13;
            }
            if (fVar14 <= fVar12) {
              fVar12 = fVar14;
            }
            fVar13 = ((float)dVar6 + *pfVar4) - pfVar2[1];
            fVar14 = -fVar13;
            if (-fVar13 <= fVar13) {
              fVar14 = fVar13;
            }
            if (fVar14 <= fVar12) {
              fVar12 = fVar14;
            }
          }
          pMVar8 = Mio_PinReadNext(pMVar8);
          iVar9 = pNode->Id;
          if (((long)iVar9 < 0) || (vSlacks->nSize <= iVar9)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          uVar10 = (ulong)(uint)vSlacks->pArray[iVar9] + lVar11;
          iVar9 = (int)uVar10;
          if ((iVar9 < 0) || (vSlacks->nSize <= iVar9)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          vSlacks->pArray[uVar10 & 0xffffffff] = (int)fVar12;
          lVar11 = lVar11 + 1;
        } while (lVar11 < (pNode->vFanins).nSize);
      }
    }
  }
  return;
}

Assistant:

void Abc_NodeDelayTraceArrival( Abc_Obj_t * pNode, Vec_Int_t * vSlacks )
{
    Abc_Obj_t * pFanin;
    Abc_Time_t * pTimeIn, * pTimeOut;
    float tDelayBlockRise, tDelayBlockFall;
    Mio_PinPhase_t PinPhase;
    Mio_Pin_t * pPin;
    int i;

    // start the arrival time of the node
    pTimeOut = Abc_NodeArrival(pNode);
    pTimeOut->Rise = pTimeOut->Fall = -ABC_INFINITY; 
    // consider the buffer
    if ( Abc_ObjIsBarBuf(pNode) )
    {
        pTimeIn = Abc_NodeArrival(Abc_ObjFanin0(pNode));
        *pTimeOut = *pTimeIn;
        return;
    }
    // go through the pins of the gate
    pPin = Mio_GateReadPins((Mio_Gate_t *)pNode->pData);
    Abc_ObjForEachFanin( pNode, pFanin, i )
    {
        pTimeIn = Abc_NodeArrival(pFanin);
        // get the interesting parameters of this pin
        PinPhase = Mio_PinReadPhase(pPin);
        tDelayBlockRise = (float)Mio_PinReadDelayBlockRise( pPin );  
        tDelayBlockFall = (float)Mio_PinReadDelayBlockFall( pPin );  
        // compute the arrival times of the positive phase
        if ( PinPhase != MIO_PHASE_INV )  // NONINV phase is present
        {
            if ( pTimeOut->Rise < pTimeIn->Rise + tDelayBlockRise )
                pTimeOut->Rise = pTimeIn->Rise + tDelayBlockRise;
            if ( pTimeOut->Fall < pTimeIn->Fall + tDelayBlockFall )
                pTimeOut->Fall = pTimeIn->Fall + tDelayBlockFall;
        }
        if ( PinPhase != MIO_PHASE_NONINV )  // INV phase is present
        {
            if ( pTimeOut->Rise < pTimeIn->Fall + tDelayBlockRise )
                pTimeOut->Rise = pTimeIn->Fall + tDelayBlockRise;
            if ( pTimeOut->Fall < pTimeIn->Rise + tDelayBlockFall )
                pTimeOut->Fall = pTimeIn->Rise + tDelayBlockFall;
        }
        pPin = Mio_PinReadNext(pPin);
    }

    // compute edge slacks
    if ( vSlacks )
    {
        float Slack;
        // go through the pins of the gate
        pPin = Mio_GateReadPins((Mio_Gate_t *)pNode->pData);
        Abc_ObjForEachFanin( pNode, pFanin, i )
        {
            pTimeIn = Abc_NodeArrival(pFanin);
            // get the interesting parameters of this pin
            PinPhase = Mio_PinReadPhase(pPin);
            tDelayBlockRise = (float)Mio_PinReadDelayBlockRise( pPin );  
            tDelayBlockFall = (float)Mio_PinReadDelayBlockFall( pPin );  
            // compute the arrival times of the positive phase
            Slack = ABC_INFINITY;
            if ( PinPhase != MIO_PHASE_INV )  // NONINV phase is present
            {
                Slack = Abc_MinFloat( Slack, Abc_AbsFloat(pTimeIn->Rise + tDelayBlockRise - pTimeOut->Rise) );
                Slack = Abc_MinFloat( Slack, Abc_AbsFloat(pTimeIn->Fall + tDelayBlockFall - pTimeOut->Fall) );
            }
            if ( PinPhase != MIO_PHASE_NONINV )  // INV phase is present
            {
                Slack = Abc_MinFloat( Slack, Abc_AbsFloat(pTimeIn->Fall + tDelayBlockRise - pTimeOut->Rise) );
                Slack = Abc_MinFloat( Slack, Abc_AbsFloat(pTimeIn->Rise + tDelayBlockFall - pTimeOut->Fall) );
            }
            pPin = Mio_PinReadNext(pPin);
            Abc_NtkDelayTraceSetSlack( vSlacks, pNode, i, Slack );
        }
    }
}